

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int server::clientconnect(int n,uint ip,char *ipstr)

{
  uint uVar1;
  int iVar2;
  clientinfo *pcVar3;
  clientinfo *ci;
  stringformatter local_130;
  string cm;
  
  pcVar3 = getinfo(n);
  pcVar3->ip = ipstr;
  local_130.buf = cm;
  ci = pcVar3;
  stringformatter::operator()(&local_130,"IP: %s",ipstr);
  if (showclientips != 0) {
    privilegemsg(3,cm);
  }
  pcVar3->ownernum = n;
  pcVar3->clientnum = n;
  pcVar3->connectmillis = totalmillis;
  uVar1 = randomMT();
  pcVar3->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&ci);
  if (ci->isSpecLocked == true) {
    forcespectator(ci);
  }
  if (ci->votedmapsucks == true) {
    ci->votedmapsucks = true;
  }
  if (gamemode < 0x17) {
    sendservinfo(ci);
    iVar2 = 0;
  }
  else {
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int clientconnect(int n, uint ip, char *ipstr)
    {
        clientinfo *ci = getinfo(n);
        ci->ip=ipstr; //QServ ci->ip
        defformatstring(cm)("IP: %s", ci->ip);
        if(showclientips) privilegemsg(PRIV_ADMIN, cm);
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        connects.add(ci);
        if(ci->isSpecLocked) forcespectator(ci);
        if(ci->votedmapsucks) ci->votedmapsucks = true;
        if(!m_mp(gamemode)) return DISC_LOCAL;
        sendservinfo(ci);
        return DISC_NONE;
    }